

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O2

void __thiscall
libtest::printer::format_rec<unsigned_long>(printer *this,string *s,usize index,unsigned_long *t)

{
  ulong index_00;
  char cVar1;
  pointer pcVar2;
  
  while( true ) {
    while( true ) {
      if (s->_M_string_length <= index) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/pachicobue[P]libtest/a_plus_b/../utils/printer.hpp"
                      ,0x3f,
                      "void libtest::printer::format_rec(const std::string &, usize, const T &, const Args...) [T = unsigned long, Args = <>]"
                     );
      }
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar1 = pcVar2[index];
      if (cVar1 == '%') break;
      index = index + 1;
      std::operator<<(this->os,cVar1);
    }
    index_00 = index + 1;
    if ((s->_M_string_length <= index_00) || (pcVar2[index_00] != '%')) break;
    index = index + 2;
    std::operator<<(this->os,'%');
  }
  std::ostream::_M_insert<unsigned_long>((ulong)this->os);
  format_rec(this,s,index_00);
  return;
}

Assistant:

void format_rec(const std::string& s, usize index, const T& t, const Args... args)
    {
        for (; index < s.size();) {
            if (s[index] == '%') {
                if (index + 1 < s.size() and s[index + 1] == '%') {
                    index += 2, os << '%';
                } else {
                    return os << t, format_rec(s, ++index, args...), static_cast<void>(0);
                }
            } else {
                os << s[index++];
            }
        }
        assert(false);
    }